

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_dup_mem_vec_mipsel
               (TCGContext_conflict4 *tcg_ctx,uint vece,TCGv_vec r,TCGv_ptr b,tcg_target_long ofs)

{
  uint uVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_dupm_vec);
  *(uint *)pTVar2 =
       (vece & 0xf) << 0xc | *(uint *)pTVar2 & 0xffff00ff | (uVar1 >> 8) + 0xe00 & 0xf00;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(b + (long)tcg_ctx);
  pTVar2->args[2] = ofs;
  return;
}

Assistant:

void tcg_gen_dup_mem_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_ptr b,
                         tcg_target_long ofs)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg bi = tcgv_ptr_arg(tcg_ctx, b);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    vec_gen_3(tcg_ctx, INDEX_op_dupm_vec, type, vece, ri, bi, ofs);
}